

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O2

void __thiscall
xray_re::xr_bone::calculate_motion(xr_bone *this,xr_skl_motion *sm,fmatrix *parent_xform)

{
  fmatrix *this_00;
  fmatrix *this_01;
  pointer ppxVar1;
  byte bVar2;
  _matrix<float> *a;
  pointer ppxVar3;
  anon_union_64_4_b9f67276_for__matrix<float>_1 local_78;
  
  bVar2 = xr_skl_motion::bone_motion_flags(sm,this->m_id);
  this_00 = &this->m_mot_xform;
  _matrix<float>::set_xyz_i(this_00,&this->m_mot_rotate);
  *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x30) =
       *(undefined8 *)&(this->m_mot_offset).field_0;
  (this->m_mot_xform).field_0.field_0._43 = (this->m_mot_offset).field_0.field_0.z;
  this_01 = &this->m_last_xform;
  _matrix<float>::mul(this_01,parent_xform,this_00);
  if ((bVar2 & 1) != 0) {
    *(undefined8 *)&(this->m_last_xform).field_0 = *(undefined8 *)&(this->m_mot_xform).field_0;
    (this->m_last_xform).field_0.field_0._13 = (this->m_mot_xform).field_0.field_0._13;
    *(undefined8 *)((long)&(this->m_last_xform).field_0 + 0x10) =
         *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x10);
    (this->m_last_xform).field_0.field_0._23 = (this->m_mot_xform).field_0.field_0._23;
    *(undefined8 *)((long)&(this->m_last_xform).field_0 + 0x20) =
         *(undefined8 *)((long)&(this->m_mot_xform).field_0 + 0x20);
    (this->m_last_xform).field_0.field_0._33 = (this->m_mot_xform).field_0.field_0._33;
    local_78._48_8_ = 0;
    local_78._56_8_ = 0;
    local_78._32_8_ = 0;
    local_78._40_8_ = 0;
    local_78._16_8_ = 0;
    local_78._24_8_ = 0;
    local_78._0_8_ = 0;
    local_78._8_8_ = 0;
    a = _matrix<float>::invert_43((_matrix<float> *)&local_78.field_0,parent_xform);
    _matrix<float>::mul_a_43(this_00,a);
  }
  _matrix<float>::mul_43(&this->m_render_xform,this_01,&this->m_bind_i_xform);
  ppxVar1 = (this->m_children).
            super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppxVar3 = (this->m_children).
                 super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppxVar3 != ppxVar1; ppxVar3 = ppxVar3 + 1) {
    calculate_motion(*ppxVar3,sm,this_01);
  }
  return;
}

Assistant:

void xr_bone::calculate_motion(xr_skl_motion* sm, const fmatrix& parent_xform)
{
	uint8_t flags = sm->bone_motion_flags(m_id);
	if (flags & xr_bone_motion::BMF_WORLD_ORIENT) {
		m_mot_xform.set_xyz_i(m_mot_rotate);
		m_mot_xform.c.set(m_mot_offset);
		m_last_xform.mul(parent_xform, m_mot_xform);

		m_last_xform.i.set(m_mot_xform.i);
		m_last_xform.j.set(m_mot_xform.j);
		m_last_xform.k.set(m_mot_xform.k);

		m_mot_xform.mul_a_43(fmatrix().invert_43(parent_xform));
	} else {
		m_mot_xform.set_xyz_i(m_mot_rotate);
		m_mot_xform.c.set(m_mot_offset);
		m_last_xform.mul(parent_xform, m_mot_xform);
	}
	m_render_xform.mul_43(m_last_xform, m_bind_i_xform);
	for (xr_bone_vec_it it = m_children.begin(), end = m_children.end(); it != end; ++it)
		(*it)->calculate_motion(sm, m_last_xform);
}